

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linkedlist.cpp
# Opt level: O3

void DeleteAfter(LinkedList *L)

{
  Node *pNVar1;
  
  pNVar1 = L->currPtr;
  if ((pNVar1 != (Node *)0x0) && (pNVar1 != L->rear)) {
    pNVar1 = DeleteAfter(pNVar1);
    if (pNVar1 == L->rear) {
      L->rear = L->currPtr;
    }
    FreeNode(pNVar1);
    L->size = L->size + -1;
    return;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"DeleteAfter: current position is invalid!",0x29);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x70);
  std::ostream::put(-0x70);
  std::ostream::flush();
  return;
}

Assistant:

void DeleteAfter(LinkedList *L) {  //链表中删除当前结点的后继结点的函数
    Node *oldNode;
    if(!L->currPtr || L->currPtr==L->rear) {   //若表为空或已到表尾，则给出错误提示并返回
        cout << "DeleteAfter: current position is invalid!" << endl;
        return ;
    }
    oldNode = DeleteAfter(L->currPtr);  //保存被删除结点的指针并从来链表中删除该结点
    if(oldNode == L->rear) {  //若删除的是表未结点，则修改表尾指针
        L->rear = L->currPtr;
    }
    FreeNode(oldNode);   //释放原当前结点
    L->size--;   //修改链表的大小
}